

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O1

void test_qclab_qgates_QGate1<std::complex<double>>(void)

{
  double *pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  double *pdVar3;
  double dVar4;
  pointer pcVar6;
  double dVar7;
  undefined *puVar8;
  undefined1 auVar10 [8];
  void *pvVar11;
  pointer pcVar12;
  double *pdVar13;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined **ppuVar16;
  _Head_base<0UL,_std::complex<double>_*,_false> _Var17;
  pointer *__ptr_7;
  char *pcVar18;
  allocator_type aVar19;
  bool bVar20;
  vector<std::complex<double>,std::allocator<std::complex<double>>> vVar21;
  undefined8 *puVar22;
  string *psVar23;
  char *in_R9;
  char *pcVar24;
  pointer pcVar25;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> _Var26;
  double *pdVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  pointer pcVar29;
  AssertHelperData *pAVar30;
  AssertHelperData *pAVar31;
  undefined1 *puVar32;
  pointer *__ptr;
  _Head_base<0UL,_std::complex<double>_*,_false> _Var33;
  pointer *__ptr_17;
  long lVar34;
  long lVar35;
  bool bVar36;
  byte bVar37;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  initializer_list<std::complex<double>_> __l_04;
  initializer_list<std::complex<double>_> __l_05;
  initializer_list<std::complex<double>_> __l_06;
  initializer_list<std::complex<double>_> __l_07;
  V vec3;
  V check3;
  V check2;
  V vec1;
  PauliX<std::complex<double>_> X;
  V vec2;
  AssertionResult gtest_ar__3;
  V check1;
  RotationY<std::complex<double>_> Y_1;
  SquareMatrix<std::complex<double>_> I1;
  SquareMatrix<std::complex<double>_> I2;
  SquareMatrix<std::complex<double>_> I3;
  V v3;
  V v2;
  V v1;
  undefined1 local_1f8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_1f0;
  pointer local_1e8;
  undefined1 local_1e0 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_1c0;
  pointer local_1b8;
  undefined1 local_1b0 [32];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_188;
  undefined1 local_170 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_168;
  pointer local_160;
  AssertHelper local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  AssertHelper local_148;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_140;
  string local_128;
  undefined1 *local_108;
  undefined8 uStack_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  SquareMatrix<std::complex<double>_> local_a8;
  SquareMatrix<std::complex<double>_> local_98;
  SquareMatrix<std::complex<double>_> local_88;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_78;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_60;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_48;
  double dVar5;
  undefined *puVar9;
  
  bVar37 = 0;
  qclab::dense::eye<std::complex<double>>((int64_t)&local_a8);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_98);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_88);
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4008000000000000;
  local_128._M_string_length = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_48,__l,(allocator_type *)local_1b0);
  local_f8 = &DAT_401c000000000000;
  uStack_f0 = 0;
  local_108 = (undefined1 *)0x4000000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4008000000000000;
  local_128._M_string_length = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_60,__l_00,(allocator_type *)local_1b0);
  puVar22 = &DAT_0045f428;
  psVar23 = &local_128;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar23->_M_dataplus)._M_p = (pointer)*puVar22;
    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
    psVar23 = (string *)((long)psVar23 + (ulong)bVar37 * -0x10 + 8);
  }
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_78,__l_01,(allocator_type *)local_1b0);
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_188.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&PTR_nbQubits_0051fe50;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1b0,
             &local_48);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_188,NoTrans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1b0,0);
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_140,__l_02,(allocator_type *)local_170);
  if (local_1b0._8_8_ - local_1b0._0_8_ ==
      (long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    local_170[0] = (allocator_type)(local_1b0._0_8_ == local_1b0._8_8_);
    if (local_1b0._0_8_ != local_1b0._8_8_) {
      aVar19 = (allocator_type)0x0;
      local_170[0] = (allocator_type)0x0;
      if (((double)*(_func_int **)local_1b0._0_8_ ==
           *(double *)
            (local_140.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_value) &&
         (local_170[0] = aVar19,
         !NAN((double)*(_func_int **)local_1b0._0_8_) &&
         !NAN(*(double *)
               (local_140.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->_M_value))) {
        if (((double)*(_func_int **)(local_1b0._0_8_ + 8) ==
             *(double *)
              ((long)(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)) &&
           (!NAN((double)*(_func_int **)(local_1b0._0_8_ + 8)) &&
            !NAN(*(double *)
                  ((long)(local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)))) {
          pdVar13 = (double *)
                    ((long)local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_value + 8);
          pcVar25 = (pointer)local_1b0._0_8_;
          while( true ) {
            pcVar29 = pcVar25 + 1;
            local_170[0] = (allocator_type)(pcVar29 == (pointer)local_1b0._8_8_);
            if ((bool)local_170[0]) break;
            local_170[0] = (allocator_type)0x0;
            if ((*(double *)pcVar29->_M_value != pdVar13[-1]) ||
               (NAN(*(double *)pcVar29->_M_value) || NAN(pdVar13[-1]))) break;
            pcVar12 = pcVar25 + 1;
            dVar4 = *pdVar13;
            dVar5 = *pdVar13;
            pdVar13 = pdVar13 + 2;
            if ((*(double *)((long)pcVar12->_M_value + 8) != dVar5) ||
               (pcVar25 = pcVar29, NAN(*(double *)((long)pcVar12->_M_value + 8)) || NAN(dVar4)))
            break;
          }
        }
      }
    }
  }
  else {
    local_170[0] = (allocator_type)0x0;
  }
  local_168._M_head_impl = (complex<double> *)0x0;
  if (local_170[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_170,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_168._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_168._M_head_impl);
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_170,
             &local_60);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_188,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_170,0);
  local_f8 = &DAT_4014000000000000;
  uStack_f0 = 0;
  local_108 = &DAT_4008000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_401c000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4000000000000000;
  local_128._M_string_length = 0;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,
             __l_03,(allocator_type *)local_1f8);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_170._1_7_,local_170[0]);
  pdVar13 = (double *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((long)local_168._M_head_impl - (long)pbVar2 == (long)local_1c0._M_head_impl - (long)pdVar13) {
    bVar36 = pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168._M_head_impl;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_168._M_head_impl) {
      pcVar6 = (pbVar2->_M_dataplus)._M_p;
      bVar20 = false;
      bVar36 = false;
      if (((double)pcVar6 == *pdVar13) && (bVar36 = bVar20, !NAN((double)pcVar6) && !NAN(*pdVar13)))
      {
        if (((double)pbVar2->_M_string_length == pdVar13[1]) &&
           (!NAN((double)pbVar2->_M_string_length) && !NAN(pdVar13[1]))) {
          pdVar13 = pdVar13 + 3;
          while( true ) {
            paVar15 = &pbVar2->field_2;
            bVar36 = paVar15 ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_168._M_head_impl;
            if (bVar36) break;
            bVar36 = false;
            if ((*(double *)paVar15 != pdVar13[-1]) || (NAN(*(double *)paVar15) || NAN(pdVar13[-1]))
               ) break;
            dVar5 = *(double *)((long)&pbVar2->field_2 + 8);
            dVar4 = *pdVar13;
            dVar7 = *pdVar13;
            pdVar13 = pdVar13 + 2;
            if ((dVar5 != dVar7) ||
               (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar15, NAN(dVar5) || NAN(dVar4))) break;
          }
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if (bVar36 == false) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_188.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_170,
             &local_60);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_188,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_170,0);
  local_f8 = (undefined1 *)0x4000000000000000;
  uStack_f0 = 0;
  local_108 = &DAT_401c000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_4008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1c8,
             &local_128);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_170._1_7_,local_170[0]);
  pdVar13 = (double *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((long)local_168._M_head_impl - (long)pbVar2 == (long)local_1c0._M_head_impl - (long)pdVar13) {
    bVar36 = pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168._M_head_impl;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_168._M_head_impl) {
      pcVar6 = (pbVar2->_M_dataplus)._M_p;
      bVar20 = false;
      bVar36 = false;
      if (((double)pcVar6 == *pdVar13) && (bVar36 = bVar20, !NAN((double)pcVar6) && !NAN(*pdVar13)))
      {
        if (((double)pbVar2->_M_string_length == pdVar13[1]) &&
           (!NAN((double)pbVar2->_M_string_length) && !NAN(pdVar13[1]))) {
          pdVar13 = pdVar13 + 3;
          while( true ) {
            paVar15 = &pbVar2->field_2;
            bVar36 = paVar15 ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_168._M_head_impl;
            if (bVar36) break;
            bVar36 = false;
            if ((*(double *)paVar15 != pdVar13[-1]) || (NAN(*(double *)paVar15) || NAN(pdVar13[-1]))
               ) break;
            dVar5 = *(double *)((long)&pbVar2->field_2 + 8);
            dVar4 = *pdVar13;
            dVar7 = *pdVar13;
            pdVar13 = pdVar13 + 2;
            if ((dVar5 != dVar7) ||
               (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar15, NAN(dVar5) || NAN(dVar4))) break;
          }
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if (bVar36 == false) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             &local_78);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_188,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,0);
  puVar22 = &DAT_0045f528;
  psVar23 = &local_128;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar23->_M_dataplus)._M_p = (pointer)*puVar22;
    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
    psVar23 = (string *)((long)psVar23 + (ulong)bVar37 * -0x10 + 8);
  }
  __l_04._M_len = 8;
  __l_04._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             __l_04,(allocator_type *)&local_158);
  pdVar13 = (double *)CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1f0._M_head_impl - (long)local_1f8 == (long)local_1d8._M_head_impl - (long)pdVar13
     ) {
    local_158.data_._0_1_ = (allocator_type)(local_1f8 == (undefined1  [8])local_1f0._M_head_impl);
    if (local_1f8 != (undefined1  [8])local_1f0._M_head_impl) {
      aVar19 = (allocator_type)0x0;
      local_158.data_._0_1_ = (allocator_type)0x0;
      if ((*(double *)local_1f8 == *pdVar13) &&
         (local_158.data_._0_1_ = aVar19, !NAN(*(double *)local_1f8) && !NAN(*pdVar13))) {
        if (((double)*(char **)((long)local_1f8 + 8) == pdVar13[1]) &&
           (!NAN((double)*(char **)((long)local_1f8 + 8)) && !NAN(pdVar13[1]))) {
          pdVar13 = pdVar13 + 3;
          auVar10 = local_1f8;
          while( true ) {
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&((AssertHelperData *)auVar10)->line;
            local_158.data_._0_1_ =
                 (allocator_type)
                 (paVar15 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1f0._M_head_impl);
            if ((bool)local_158.data_._0_1_) break;
            local_158.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar15 != pdVar13[-1]) || (NAN(*(double *)paVar15) || NAN(pdVar13[-1]))
               ) break;
            pcVar6 = (((AssertHelperData *)auVar10)->message)._M_dataplus._M_p;
            dVar5 = *pdVar13;
            dVar4 = *pdVar13;
            pdVar13 = pdVar13 + 2;
            if (((double)pcVar6 != dVar4) ||
               (auVar10 = (undefined1  [8])paVar15, NAN((double)pcVar6) || NAN(dVar5))) break;
          }
        }
      }
    }
  }
  else {
    local_158.data_._0_1_ = (allocator_type)0x0;
  }
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_158.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_158,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_188.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             &local_78);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_188,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,0);
  puVar22 = &DAT_0045f5a8;
  psVar23 = &local_128;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar23->_M_dataplus)._M_p = (pointer)*puVar22;
    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
    psVar23 = (string *)((long)psVar23 + ((ulong)bVar37 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1e0,
             &local_128,&local_a8);
  pdVar13 = (double *)CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1f0._M_head_impl - (long)local_1f8 == (long)local_1d8._M_head_impl - (long)pdVar13
     ) {
    local_158.data_._0_1_ = (allocator_type)(local_1f8 == (undefined1  [8])local_1f0._M_head_impl);
    if (local_1f8 != (undefined1  [8])local_1f0._M_head_impl) {
      aVar19 = (allocator_type)0x0;
      local_158.data_._0_1_ = (allocator_type)0x0;
      if ((*(double *)local_1f8 == *pdVar13) &&
         (local_158.data_._0_1_ = aVar19, !NAN(*(double *)local_1f8) && !NAN(*pdVar13))) {
        if (((double)*(char **)((long)local_1f8 + 8) == pdVar13[1]) &&
           (!NAN((double)*(char **)((long)local_1f8 + 8)) && !NAN(pdVar13[1]))) {
          pdVar13 = pdVar13 + 3;
          auVar10 = local_1f8;
          while( true ) {
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&((AssertHelperData *)auVar10)->line;
            local_158.data_._0_1_ =
                 (allocator_type)
                 (paVar15 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1f0._M_head_impl);
            if ((bool)local_158.data_._0_1_) break;
            local_158.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar15 != pdVar13[-1]) || (NAN(*(double *)paVar15) || NAN(pdVar13[-1]))
               ) break;
            pcVar6 = (((AssertHelperData *)auVar10)->message)._M_dataplus._M_p;
            dVar5 = *pdVar13;
            dVar4 = *pdVar13;
            pdVar13 = pdVar13 + 2;
            if (((double)pcVar6 != dVar4) ||
               (auVar10 = (undefined1  [8])paVar15, NAN((double)pcVar6) || NAN(dVar5))) break;
          }
        }
      }
    }
  }
  else {
    local_158.data_._0_1_ = (allocator_type)0x0;
  }
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_158.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_158,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_188.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,2);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             &local_78);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&local_188,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,0);
  puVar22 = &DAT_0045f628;
  psVar23 = &local_128;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar23->_M_dataplus)._M_p = (pointer)*puVar22;
    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
    psVar23 = (string *)((long)psVar23 + ((ulong)bVar37 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1e0,
             &local_128,&local_a8);
  pdVar13 = (double *)CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1f0._M_head_impl - (long)local_1f8 == (long)local_1d8._M_head_impl - (long)pdVar13
     ) {
    local_158.data_._0_1_ = (allocator_type)(local_1f8 == (undefined1  [8])local_1f0._M_head_impl);
    if (local_1f8 != (undefined1  [8])local_1f0._M_head_impl) {
      aVar19 = (allocator_type)0x0;
      local_158.data_._0_1_ = (allocator_type)0x0;
      if ((*(double *)local_1f8 == *pdVar13) &&
         (local_158.data_._0_1_ = aVar19, !NAN(*(double *)local_1f8) && !NAN(*pdVar13))) {
        if (((double)*(char **)((long)local_1f8 + 8) == pdVar13[1]) &&
           (!NAN((double)*(char **)((long)local_1f8 + 8)) && !NAN(pdVar13[1]))) {
          pdVar13 = pdVar13 + 3;
          auVar10 = local_1f8;
          while( true ) {
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&((AssertHelperData *)auVar10)->line;
            local_158.data_._0_1_ =
                 (allocator_type)
                 (paVar15 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1f0._M_head_impl);
            if ((bool)local_158.data_._0_1_) break;
            local_158.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar15 != pdVar13[-1]) || (NAN(*(double *)paVar15) || NAN(pdVar13[-1]))
               ) break;
            pcVar6 = (((AssertHelperData *)auVar10)->message)._M_dataplus._M_p;
            dVar5 = *pdVar13;
            dVar4 = *pdVar13;
            pdVar13 = pdVar13 + 2;
            if (((double)pcVar6 != dVar4) ||
               (auVar10 = (undefined1  [8])paVar15, NAN((double)pcVar6) || NAN(dVar5))) break;
          }
        }
      }
    }
  }
  else {
    local_158.data_._0_1_ = (allocator_type)0x0;
  }
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_158.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_158,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  pvVar11 = (void *)CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_1d0 - (long)pvVar11);
  }
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  pvVar11 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_1b8 - (long)pvVar11);
  }
  pvVar11 = (void *)CONCAT71(local_170._1_7_,local_170[0]);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_160 - (long)pvVar11);
  }
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1b0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ - local_1b0._0_8_);
  }
  local_1b0._8_8_ = (ulong)(uint3)local_1b0._13_3_ << 0x28;
  local_1b0._16_8_ = (pointer)0x0;
  local_1b0._24_8_ = 1.0;
  local_1b0._0_8_ = &PTR_nbQubits_00521598;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_140,&local_48);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,1,&local_140,0);
  local_128.field_2._M_allocated_capacity = 0xc008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_170,
             __l_05,(allocator_type *)local_1c8);
  pdVar13 = (double *)CONCAT71(local_170._1_7_,local_170[0]);
  if ((long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start == (long)local_168._M_head_impl - (long)pdVar13) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   (local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                   local_140.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
    if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      vVar21 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)
            (local_140.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_value == *pdVar13) &&
         (local_1c8[0] = vVar21,
         !NAN(*(double *)
               (local_140.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->_M_value) && !NAN(*pdVar13))) {
        if ((*(double *)
              ((long)(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8) == pdVar13[1]) &&
           (!NAN(*(double *)
                  ((long)(local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)) &&
            !NAN(pdVar13[1]))) {
          pdVar13 = pdVar13 + 3;
          pcVar25 = local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            pcVar29 = pcVar25 + 1;
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           (pcVar29 ==
                           local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
            if ((bool)local_1c8[0]) break;
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
            if ((*(double *)pcVar29->_M_value != pdVar13[-1]) ||
               (NAN(*(double *)pcVar29->_M_value) || NAN(pdVar13[-1]))) break;
            pcVar12 = pcVar25 + 1;
            dVar5 = *pdVar13;
            dVar4 = *pdVar13;
            pdVar13 = pdVar13 + 2;
            if ((*(double *)((long)pcVar12->_M_value + 8) != dVar4) ||
               (pcVar25 = pcVar29, NAN(*(double *)((long)pcVar12->_M_value + 8)) || NAN(dVar5)))
            break;
          }
        }
      }
    }
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_1f8 + 8))();
    }
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,
             &local_60);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,0);
  local_f8 = (undefined1 *)0xc014000000000000;
  uStack_f0 = 0;
  local_108 = (undefined1 *)0xc008000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = (size_type)&DAT_401c000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4000000000000000;
  local_128._M_string_length = 0;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1f8,
             __l_06,(allocator_type *)local_1e0);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((long)local_1c0._M_head_impl - (long)pbVar2 == (long)local_1f0._M_head_impl - (long)local_1f8)
  {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   (pbVar2 ==
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c0._M_head_impl);
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1c0._M_head_impl) {
      pcVar6 = (pbVar2->_M_dataplus)._M_p;
      vVar21 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if (((double)pcVar6 == *(double *)local_1f8) &&
         (local_1e0[0] = vVar21, !NAN((double)pcVar6) && !NAN(*(double *)local_1f8))) {
        if (((double)pbVar2->_M_string_length == (double)*(char **)((long)local_1f8 + 8)) &&
           (!NAN((double)pbVar2->_M_string_length) && !NAN((double)*(char **)((long)local_1f8 + 8)))
           ) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_1f8 + 0x18);
          while( true ) {
            paVar28 = &pbVar2->field_2;
            local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           (paVar28 ==
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_1c0._M_head_impl);
            if ((bool)local_1e0[0]) break;
            local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
            if ((*(double *)paVar28 != *(double *)((long)paVar15 + -8)) ||
               (NAN(*(double *)paVar28) || NAN(*(double *)((long)paVar15 + -8)))) break;
            dVar5 = *(double *)((long)&pbVar2->field_2 + 8);
            dVar4 = *(double *)paVar15;
            dVar7 = *(double *)paVar15;
            paVar15 = paVar15 + 1;
            if ((dVar5 != dVar7) ||
               (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar28, NAN(dVar5) || NAN(dVar4))) break;
          }
        }
      }
    }
  }
  else {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if (local_1e0[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1e0,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(undefined **)
                    (local_188.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if (local_1d8._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._M_head_impl);
  }
  local_1b0._8_4_ = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,
             &local_60);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1c8,0);
  local_f8 = (undefined1 *)0xc000000000000000;
  uStack_f0 = 0;
  local_108 = &DAT_401c000000000000;
  uStack_100 = 0;
  local_128.field_2._M_allocated_capacity = 0xc008000000000000;
  local_128.field_2._8_8_ = 0;
  local_128._M_dataplus._M_p = &DAT_4014000000000000;
  local_128._M_string_length = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_1f8,
             &local_128);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((long)local_1c0._M_head_impl - (long)pbVar2 == (long)local_1f0._M_head_impl - (long)local_1f8)
  {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   (pbVar2 ==
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c0._M_head_impl);
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1c0._M_head_impl) {
      pcVar6 = (pbVar2->_M_dataplus)._M_p;
      vVar21 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if (((double)pcVar6 == *(double *)local_1f8) &&
         (local_1e0[0] = vVar21, !NAN((double)pcVar6) && !NAN(*(double *)local_1f8))) {
        if (((double)pbVar2->_M_string_length == (double)*(char **)((long)local_1f8 + 8)) &&
           (!NAN((double)pbVar2->_M_string_length) && !NAN((double)*(char **)((long)local_1f8 + 8)))
           ) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_1f8 + 0x18);
          while( true ) {
            paVar28 = &pbVar2->field_2;
            local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           (paVar28 ==
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_1c0._M_head_impl);
            if ((bool)local_1e0[0]) break;
            local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
            if ((*(double *)paVar28 != *(double *)((long)paVar15 + -8)) ||
               (NAN(*(double *)paVar28) || NAN(*(double *)((long)paVar15 + -8)))) break;
            dVar5 = *(double *)((long)&pbVar2->field_2 + 8);
            dVar4 = *(double *)paVar15;
            dVar7 = *(double *)paVar15;
            paVar15 = paVar15 + 1;
            if ((dVar5 != dVar7) ||
               (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar28, NAN(dVar5) || NAN(dVar4))) break;
          }
        }
      }
    }
  }
  else {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if (local_1e0[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1e0,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(undefined **)
                    (local_188.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if (local_1d8._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._M_head_impl);
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             &local_78);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,0);
  puVar22 = &DAT_0045f728;
  psVar23 = &local_128;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar23->_M_dataplus)._M_p = (pointer)*puVar22;
    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
    psVar23 = (string *)((long)psVar23 + (ulong)bVar37 * -0x10 + 8);
  }
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&local_128;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_188,__l_07,(allocator_type *)&local_158);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1d8._M_head_impl - (long)pbVar2 ==
      (long)local_188.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_188.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    local_158.data_._0_1_ =
         (allocator_type)
         (pbVar2 ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_head_impl
         );
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1d8._M_head_impl) {
      pcVar6 = (pbVar2->_M_dataplus)._M_p;
      aVar19 = (allocator_type)0x0;
      local_158.data_._0_1_ = (allocator_type)0x0;
      if (((double)pcVar6 ==
           (double)*(undefined **)
                    (local_188.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value) &&
         (local_158.data_._0_1_ = aVar19,
         !NAN((double)pcVar6) &&
         !NAN((double)*(undefined **)
                       (local_188.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_value))) {
        if (((double)pbVar2->_M_string_length ==
             (double)*(undefined **)
                      ((long)(local_188.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)) &&
           (!NAN((double)pbVar2->_M_string_length) &&
            !NAN((double)*(undefined **)
                          ((long)(local_188.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)))) {
          ppuVar16 = (undefined **)
                     ((long)local_188.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_value + 8);
          while( true ) {
            paVar15 = &pbVar2->field_2;
            local_158.data_._0_1_ =
                 (allocator_type)
                 (paVar15 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1d8._M_head_impl);
            if ((bool)local_158.data_._0_1_) break;
            local_158.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar15 != (double)ppuVar16[-1]) ||
               (NAN(*(double *)paVar15) || NAN((double)ppuVar16[-1]))) break;
            dVar5 = *(double *)((long)&pbVar2->field_2 + 8);
            puVar8 = *ppuVar16;
            puVar9 = *ppuVar16;
            ppuVar16 = ppuVar16 + 2;
            if ((dVar5 != (double)puVar9) ||
               (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar15, NAN(dVar5) || NAN((double)puVar8))) break;
          }
        }
      }
    }
  }
  else {
    local_158.data_._0_1_ = (allocator_type)0x0;
  }
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_158.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_158,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffff00000000;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             &local_78);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,0);
  puVar22 = &DAT_0045f7a8;
  psVar23 = &local_128;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar23->_M_dataplus)._M_p = (pointer)*puVar22;
    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
    psVar23 = (string *)((long)psVar23 + ((ulong)bVar37 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_188,
             &local_128,&local_a8);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1d8._M_head_impl - (long)pbVar2 ==
      (long)local_188.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_188.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    local_158.data_._0_1_ =
         (allocator_type)
         (pbVar2 ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_head_impl
         );
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1d8._M_head_impl) {
      pcVar6 = (pbVar2->_M_dataplus)._M_p;
      aVar19 = (allocator_type)0x0;
      local_158.data_._0_1_ = (allocator_type)0x0;
      if (((double)pcVar6 ==
           (double)*(undefined **)
                    (local_188.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value) &&
         (local_158.data_._0_1_ = aVar19,
         !NAN((double)pcVar6) &&
         !NAN((double)*(undefined **)
                       (local_188.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_value))) {
        if (((double)pbVar2->_M_string_length ==
             (double)*(undefined **)
                      ((long)(local_188.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)) &&
           (!NAN((double)pbVar2->_M_string_length) &&
            !NAN((double)*(undefined **)
                          ((long)(local_188.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)))) {
          ppuVar16 = (undefined **)
                     ((long)local_188.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_value + 8);
          while( true ) {
            paVar15 = &pbVar2->field_2;
            local_158.data_._0_1_ =
                 (allocator_type)
                 (paVar15 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1d8._M_head_impl);
            if ((bool)local_158.data_._0_1_) break;
            local_158.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar15 != (double)ppuVar16[-1]) ||
               (NAN(*(double *)paVar15) || NAN((double)ppuVar16[-1]))) break;
            dVar5 = *(double *)((long)&pbVar2->field_2 + 8);
            puVar8 = *ppuVar16;
            puVar9 = *ppuVar16;
            ppuVar16 = ppuVar16 + 2;
            if ((dVar5 != (double)puVar9) ||
               (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar15, NAN(dVar5) || NAN((double)puVar8))) break;
          }
        }
      }
    }
  }
  else {
    local_158.data_._0_1_ = (allocator_type)0x0;
  }
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_158.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_158,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  local_1b0._8_4_ = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,
             &local_78);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)local_1b0,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_1e0,0);
  puVar22 = &DAT_0045f828;
  psVar23 = &local_128;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar23->_M_dataplus)._M_p = (pointer)*puVar22;
    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
    psVar23 = (string *)((long)psVar23 + ((ulong)bVar37 * -2 + 1) * 8);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_188,
             &local_128,&local_a8);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if ((long)local_1d8._M_head_impl - (long)pbVar2 ==
      (long)local_188.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_188.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    local_158.data_._0_1_ =
         (allocator_type)
         (pbVar2 ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_head_impl
         );
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1d8._M_head_impl) {
      pcVar6 = (pbVar2->_M_dataplus)._M_p;
      aVar19 = (allocator_type)0x0;
      local_158.data_._0_1_ = (allocator_type)0x0;
      if (((double)pcVar6 ==
           (double)*(undefined **)
                    (local_188.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_value) &&
         (local_158.data_._0_1_ = aVar19,
         !NAN((double)pcVar6) &&
         !NAN((double)*(undefined **)
                       (local_188.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_value))) {
        if (((double)pbVar2->_M_string_length ==
             (double)*(undefined **)
                      ((long)(local_188.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)) &&
           (!NAN((double)pbVar2->_M_string_length) &&
            !NAN((double)*(undefined **)
                          ((long)(local_188.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8)))) {
          ppuVar16 = (undefined **)
                     ((long)local_188.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_value + 8);
          while( true ) {
            paVar15 = &pbVar2->field_2;
            local_158.data_._0_1_ =
                 (allocator_type)
                 (paVar15 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1d8._M_head_impl);
            if ((bool)local_158.data_._0_1_) break;
            local_158.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar15 != (double)ppuVar16[-1]) ||
               (NAN(*(double *)paVar15) || NAN((double)ppuVar16[-1]))) break;
            dVar5 = *(double *)((long)&pbVar2->field_2 + 8);
            puVar8 = *ppuVar16;
            puVar9 = *ppuVar16;
            ppuVar16 = ppuVar16 + 2;
            if ((dVar5 != (double)puVar9) ||
               (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar15, NAN(dVar5) || NAN((double)puVar8))) break;
          }
        }
      }
    }
  }
  else {
    local_158.data_._0_1_ = (allocator_type)0x0;
  }
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_158.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_158,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  if (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar11 = (void *)CONCAT71(local_1e0._1_7_,local_1e0[0]);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_1d0 - (long)pvVar11);
  }
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  pvVar11 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_1b8 - (long)pvVar11);
  }
  pvVar11 = (void *)CONCAT71(local_170._1_7_,local_170[0]);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_160 - (long)pvVar11);
  }
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffff00000000;
  local_1b0._0_8_ = &PTR_nbQubits_0051fe50;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&local_140,&local_a8);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  pdVar13 = (double *)operator_new__(0x40);
  pdVar13[2] = 0.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 0.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  *pdVar13 = 0.0;
  pdVar13[1] = 0.0;
  pdVar13[2] = 1.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 1.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  local_170[0] = (allocator_type)0x0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    local_170[0] = (allocator_type)0x0;
    if ((*pdVar13 ==
         *(double *)
          local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
       (!NAN(*pdVar13) &&
        !NAN(*(double *)
              local_140.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish))) {
      local_170[0] = (allocator_type)0x0;
      if ((pdVar13[1] ==
           *(double *)
            ((long)local_140.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 8)) &&
         (!NAN(pdVar13[1]) &&
          !NAN(*(double *)
                ((long)local_140.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 8)))) {
        pcVar24 = (char *)0x0;
        local_170[0] = (allocator_type)0x0;
        _Var26._M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
             (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
             local_140.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        pdVar27 = pdVar13;
        do {
          lVar14 = 0x18;
          lVar34 = 0;
          while( true ) {
            if (lVar34 == 1) goto LAB_001ab68c;
            dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
            lVar34 = lVar34 + 1;
            pdVar3 = (double *)
                     ((long)((long)_Var26._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + -8) + lVar14);
            if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
            pdVar3 = (double *)((long)pdVar27 + lVar14);
            pdVar1 = (double *)
                     ((long)_Var26._M_t.
                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                     lVar14);
            lVar14 = lVar14 + 0x10;
            if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
          }
          if (lVar34 < 2) break;
LAB_001ab68c:
          pcVar24 = pcVar24 + 1;
          local_170[0] = (allocator_type)(1 < (long)pcVar24);
          if (pcVar24 == (char *)0x2) break;
          pcVar25 = (pointer)((long)local_140.
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                             (long)pcVar24 * 0x20);
          if ((pdVar13[(long)pcVar24 * 4] != *(double *)pcVar25->_M_value) ||
             (NAN(pdVar13[(long)pcVar24 * 4]) || NAN(*(double *)pcVar25->_M_value))) break;
          pdVar27 = pdVar27 + 4;
          _Var26._M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
               (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
               ((long)_Var26._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20);
          if ((pdVar13[(long)pcVar24 * 4 + 1] !=
               ((double *)
               ((long)local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8))[(long)pcVar24 * 4]) ||
             (NAN(pdVar13[(long)pcVar24 * 4 + 1]) ||
              NAN(((double *)
                  ((long)local_140.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 8))[(long)pcVar24 * 4])))
          break;
        } while( true );
      }
    }
  }
  local_168._M_head_impl = (complex<double> *)0x0;
  operator_delete__(pdVar13);
  if (local_170[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_170,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_168._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_168._M_head_impl);
  }
  local_128._M_dataplus._M_p = (pointer)0x2;
  local_128._M_string_length = (size_type)operator_new__(0x40);
  *(double *)(local_128._M_string_length + 0x30) = 0.0;
  *(double *)(local_128._M_string_length + 0x38) = 0.0;
  *(double *)(local_128._M_string_length + 0x20) = 0.0;
  *(double *)(local_128._M_string_length + 0x28) = 0.0;
  *(double *)(local_128._M_string_length + 0x10) = 0.0;
  *(double *)(local_128._M_string_length + 0x18) = 0.0;
  *(double *)local_128._M_string_length = 0.0;
  *(double *)(local_128._M_string_length + 8) = 0.0;
  *(double *)local_128._M_string_length = 2.0;
  *(double *)(local_128._M_string_length + 8) = 0.0;
  *(undefined1 **)(local_128._M_string_length + 0x10) = &DAT_4014000000000000;
  *(double *)(local_128._M_string_length + 0x18) = 0.0;
  *(undefined1 **)(local_128._M_string_length + 0x20) = &DAT_4008000000000000;
  *(double *)(local_128._M_string_length + 0x28) = 0.0;
  *(undefined1 **)(local_128._M_string_length + 0x30) = &DAT_401c000000000000;
  *(double *)(local_128._M_string_length + 0x38) = 0.0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&local_140,
             (SquareMatrix<std::complex<double>_> *)&local_128);
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  pcVar25 = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  pdVar13 = (double *)operator_new__(0x40);
  *pdVar13 = 0.0;
  pdVar13[1] = 0.0;
  pdVar13[2] = 0.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 0.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  *pdVar13 = (double)&DAT_4008000000000000;
  local_170[0] = (allocator_type)0x0;
  pdVar13[1] = 0.0;
  pdVar13[2] = (double)&DAT_401c000000000000;
  pdVar13[3] = 0.0;
  pdVar13[4] = 2.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = (double)&DAT_4014000000000000;
  pdVar13[7] = 0.0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    local_170[0] = (allocator_type)0x0;
    if ((*pdVar13 ==
         *(double *)
          (local_140.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value) &&
       (!NAN(*pdVar13) &&
        !NAN(*(double *)
              (local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->_M_value))) {
      if ((pdVar13[1] ==
           *(double *)
            ((long)(local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_value + 8)) &&
         (!NAN(pdVar13[1]) &&
          !NAN(*(double *)
                ((long)(local_140.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_value + 8)))) {
        lVar14 = 0;
        local_170[0] = (allocator_type)0x0;
        pcVar25 = local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pdVar27 = pdVar13;
        do {
          lVar34 = 0x18;
          lVar35 = 0;
          while( true ) {
            if (lVar35 == 1) goto LAB_001ab97f;
            dVar5 = *(double *)((long)pdVar27 + lVar34 + -8);
            lVar35 = lVar35 + 1;
            pdVar3 = (double *)((long)pcVar25->_M_value + lVar34 + -8);
            if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
            pdVar3 = (double *)((long)pdVar27 + lVar34);
            pdVar1 = (double *)((long)pcVar25->_M_value + lVar34);
            lVar34 = lVar34 + 0x10;
            if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
          }
          if (lVar35 < 2) break;
LAB_001ab97f:
          lVar14 = lVar14 + 1;
          local_170[0] = (allocator_type)(1 < lVar14);
          if (lVar14 == 2) break;
          if ((pdVar13[lVar14 * 4] !=
               *(double *)
                local_140.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value) ||
             (NAN(pdVar13[lVar14 * 4]) ||
              NAN(*(double *)
                   local_140.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value))) break;
          pdVar27 = pdVar27 + 4;
          pcVar25 = pcVar25 + 2;
          if ((pdVar13[lVar14 * 4 + 1] !=
               *(double *)
                ((long)local_140.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value + 8)) ||
             (NAN(pdVar13[lVar14 * 4 + 1]) ||
              NAN(*(double *)
                   ((long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value + 8))))
          break;
        } while( true );
      }
    }
  }
  local_168._M_head_impl = (complex<double> *)0x0;
  if (!(bool)local_170[0]) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_170,(AssertionResult *)"mat1 == check1","false","true",
               (char *)pcVar25);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_168._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_168._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_170,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,(SquareMatrix<std::complex<double>_> *)local_1f8,&local_a8);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_170._1_7_,local_170[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar15) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)paVar15 < 1);
    if (0 < (long)paVar15) {
      local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)local_128._M_string_length ==
           (double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p) &&
         (!NAN(*(double *)local_128._M_string_length) &&
          !NAN((double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)(local_128._M_string_length + 8) ==
             *(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)(local_128._M_string_length + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)))) {
          pcVar24 = (char *)((long)paVar15 * 0x10);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          pdVar27 = (double *)local_128._M_string_length;
          _Var17._M_head_impl = local_168._M_head_impl;
          do {
            lVar14 = 0x18;
            pcVar18 = (char *)0x0;
            while( true ) {
              if (paVar15->_M_local_buf + -1 == pcVar18) goto LAB_001abbe6;
              dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
              pcVar18 = pcVar18 + 1;
              pdVar3 = (double *)((long)_Var17._M_head_impl + lVar14 + -8);
              if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
              pdVar3 = (double *)((long)pdVar27 + lVar14);
              pdVar1 = (double *)
                       ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)_Var17._M_head_impl)->_M_dataplus)._M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
            }
            if ((long)pcVar18 < (long)paVar15) break;
LAB_001abbe6:
            paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar28->_M_local_buf + 1);
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)paVar15 <= (long)paVar28);
            if (paVar28 == paVar15) break;
            if ((*(double *)
                  (local_128._M_string_length +
                  (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8) !=
                 *(double *)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8)) ||
                NAN(*(double *)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value)))
            break;
            pdVar27 = pdVar27 + (long)local_128._M_dataplus._M_p * 2;
            _Var17._M_head_impl =
                 (complex<double> *)
                 (pcVar24 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var17._M_head_impl)->_M_dataplus);
            if ((*(double *)
                  (local_128._M_string_length +
                  ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8) !=
                 *(double *)
                  ((long)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8)) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8)) ||
                NAN(*(double *)
                     ((long)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8))))
            break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  local_1b0._8_4_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_170,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a8,(SquareMatrix<std::complex<double>_> *)local_1f8);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_170._1_7_,local_170[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar15) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)paVar15 < 1);
    if (0 < (long)paVar15) {
      local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)local_128._M_string_length == *(double *)local_168._M_head_impl) &&
         (!NAN(*(double *)local_128._M_string_length) && !NAN(*(double *)local_168._M_head_impl))) {
        if ((*(double *)(local_128._M_string_length + 8) ==
             *(double *)((long)local_168._M_head_impl + 8)) &&
           (!NAN(*(double *)(local_128._M_string_length + 8)) &&
            !NAN(*(double *)((long)local_168._M_head_impl + 8)))) {
          pcVar24 = (char *)((long)paVar15 * 0x10);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          pdVar27 = (double *)local_128._M_string_length;
          _Var17._M_head_impl = (complex<double> *)local_168;
          do {
            lVar14 = 0x18;
            pcVar18 = (char *)0x0;
            while( true ) {
              if (paVar15->_M_local_buf + -1 == pcVar18) goto LAB_001abe87;
              dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
              pcVar18 = pcVar18 + 1;
              pdVar3 = (double *)
                       ((long)((_Alloc_hider *)(_Var17._M_head_impl)->_M_value + -1) + lVar14);
              if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
              pdVar3 = (double *)((long)pdVar27 + lVar14);
              pdVar1 = (double *)
                       ((long)&((_Alloc_hider *)(_Var17._M_head_impl)->_M_value)->_M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
            }
            if ((long)pcVar18 < (long)paVar15) break;
LAB_001abe87:
            paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar28->_M_local_buf + 1);
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)paVar15 <= (long)paVar28);
            if (paVar28 == paVar15) break;
            pdVar3 = (double *)((long)local_168._M_head_impl + (long)paVar28 * (long)paVar15 * 0x10)
            ;
            if ((*(double *)
                  (local_128._M_string_length +
                  (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8) != *pdVar3) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8)) || NAN(*pdVar3)))
            break;
            pdVar27 = pdVar27 + (long)local_128._M_dataplus._M_p * 2;
            _Var17._M_head_impl = _Var17._M_head_impl + (long)paVar15;
            if ((*(double *)
                  (local_128._M_string_length +
                  ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8) !=
                 (double)((size_type *)((long)local_168._M_head_impl + 8))
                         [(long)paVar28 * (long)paVar15 * 2]) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8)) ||
                NAN((double)((size_type *)((long)local_168._M_head_impl + 8))
                            [(long)paVar28 * (long)paVar15 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_88);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x2;
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)operator_new__(0x40);
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0;
  *(undefined8 *)
   ((long)(local_188.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0;
  *(undefined8 *)
   ((long)(local_188.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1e0,(SquareMatrix<std::complex<double>_> *)&local_188,&local_a8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a8,(SquareMatrix<std::complex<double>_> *)local_1e0);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar15) {
    bVar36 = (long)paVar15 < 1;
    if (0 < (long)paVar15) {
      bVar36 = false;
      if ((*(double *)local_128._M_string_length ==
           (double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p) &&
         (!NAN(*(double *)local_128._M_string_length) &&
          !NAN((double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)(local_128._M_string_length + 8) ==
             *(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)(local_128._M_string_length + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)))) {
          pcVar24 = (char *)((long)paVar15 * 0x10);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          bVar36 = false;
          pdVar27 = (double *)local_128._M_string_length;
          _Var17._M_head_impl = local_1c0._M_head_impl;
          do {
            lVar14 = 0x18;
            pcVar18 = (char *)0x0;
            while( true ) {
              if (paVar15->_M_local_buf + -1 == pcVar18) goto LAB_001ac12e;
              dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
              pcVar18 = pcVar18 + 1;
              pdVar3 = (double *)((long)_Var17._M_head_impl + lVar14 + -8);
              if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
              pdVar3 = (double *)((long)pdVar27 + lVar14);
              pdVar1 = (double *)
                       ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)_Var17._M_head_impl)->_M_dataplus)._M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
            }
            if ((long)pcVar18 < (long)paVar15) break;
LAB_001ac12e:
            paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar28->_M_local_buf + 1);
            bVar36 = (long)paVar15 <= (long)paVar28;
            if (paVar28 == paVar15) break;
            if ((*(double *)
                  (local_128._M_string_length +
                  (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8) !=
                 *(double *)local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8)) ||
                NAN(*(double *)local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value)))
            break;
            pdVar27 = pdVar27 + (long)local_128._M_dataplus._M_p * 2;
            _Var17._M_head_impl =
                 (complex<double> *)
                 (pcVar24 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var17._M_head_impl)->_M_dataplus);
            if ((((double *)(local_128._M_string_length + 8))
                 [(long)paVar28 * (long)local_128._M_dataplus._M_p * 2] !=
                 *(double *)(local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8)) ||
               (NAN(((double *)(local_128._M_string_length + 8))
                    [(long)paVar28 * (long)local_128._M_dataplus._M_p * 2]) ||
                NAN(*(double *)(local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8))
               )) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1d8._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1d8._M_head_impl);
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_188.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  if (local_168._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_168._M_head_impl);
  }
  operator_delete__(pdVar13);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffff00000000;
  local_1b0._0_8_ = &PTR_nbQubits_0051fe50;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&local_140,&local_a8);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  pdVar13 = (double *)operator_new__(0x40);
  pdVar13[2] = 0.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 0.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  *pdVar13 = 0.0;
  pdVar13[1] = 0.0;
  pdVar13[2] = 1.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 1.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  local_170[0] = (allocator_type)0x0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    local_170[0] = (allocator_type)0x0;
    if ((*pdVar13 ==
         *(double *)
          local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
       (!NAN(*pdVar13) &&
        !NAN(*(double *)
              local_140.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish))) {
      local_170[0] = (allocator_type)0x0;
      if ((pdVar13[1] ==
           *(double *)
            ((long)local_140.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 8)) &&
         (!NAN(pdVar13[1]) &&
          !NAN(*(double *)
                ((long)local_140.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 8)))) {
        pcVar24 = (char *)0x0;
        local_170[0] = (allocator_type)0x0;
        _Var17._M_head_impl =
             local_140.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        pdVar27 = pdVar13;
        do {
          lVar14 = 0x18;
          lVar34 = 0;
          while( true ) {
            if (lVar34 == 1) goto LAB_001ac3e7;
            dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
            lVar34 = lVar34 + 1;
            pdVar3 = (double *)((long)(_Var17._M_head_impl)->_M_value + lVar14 + -8);
            if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
            pdVar3 = (double *)((long)pdVar27 + lVar14);
            pdVar1 = (double *)((long)(_Var17._M_head_impl)->_M_value + lVar14);
            lVar14 = lVar14 + 0x10;
            if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
          }
          if (lVar34 < 2) break;
LAB_001ac3e7:
          pcVar24 = pcVar24 + 1;
          local_170[0] = (allocator_type)(1 < (long)pcVar24);
          if (pcVar24 == (char *)0x2) break;
          pcVar25 = (pointer)((long)local_140.
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                             (long)pcVar24 * 0x20);
          if ((pdVar13[(long)pcVar24 * 4] != *(double *)pcVar25->_M_value) ||
             (NAN(pdVar13[(long)pcVar24 * 4]) || NAN(*(double *)pcVar25->_M_value))) break;
          pdVar27 = pdVar27 + 4;
          _Var17._M_head_impl = _Var17._M_head_impl + 2;
          if ((pdVar13[(long)pcVar24 * 4 + 1] !=
               ((double *)
               ((long)local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8))[(long)pcVar24 * 4]) ||
             (NAN(pdVar13[(long)pcVar24 * 4 + 1]) ||
              NAN(((double *)
                  ((long)local_140.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 8))[(long)pcVar24 * 4])))
          break;
        } while( true );
      }
    }
  }
  local_168._M_head_impl = (complex<double> *)0x0;
  operator_delete__(pdVar13);
  if (local_170[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_170,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_168._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_168._M_head_impl);
  }
  local_128._M_dataplus._M_p = (pointer)0x2;
  local_128._M_string_length = (size_type)operator_new__(0x40);
  *(double *)(local_128._M_string_length + 0x30) = 0.0;
  *(double *)(local_128._M_string_length + 0x38) = 0.0;
  *(double *)(local_128._M_string_length + 0x20) = 0.0;
  *(double *)(local_128._M_string_length + 0x28) = 0.0;
  *(double *)(local_128._M_string_length + 0x10) = 0.0;
  *(double *)(local_128._M_string_length + 0x18) = 0.0;
  *(double *)local_128._M_string_length = 0.0;
  *(double *)(local_128._M_string_length + 8) = 0.0;
  *(double *)local_128._M_string_length = 2.0;
  *(double *)(local_128._M_string_length + 8) = 0.0;
  *(undefined1 **)(local_128._M_string_length + 0x10) = &DAT_4014000000000000;
  *(double *)(local_128._M_string_length + 0x18) = 0.0;
  *(undefined1 **)(local_128._M_string_length + 0x20) = &DAT_4008000000000000;
  *(double *)(local_128._M_string_length + 0x28) = 0.0;
  *(undefined1 **)(local_128._M_string_length + 0x30) = &DAT_401c000000000000;
  *(double *)(local_128._M_string_length + 0x38) = 0.0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&local_140,
             (SquareMatrix<std::complex<double>_> *)&local_128);
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  pcVar25 = (pointer)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)&local_140,0);
  pdVar13 = (double *)operator_new__(0x40);
  *pdVar13 = 0.0;
  pdVar13[1] = 0.0;
  pdVar13[2] = 0.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 0.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  *pdVar13 = (double)&DAT_4014000000000000;
  local_170[0] = (allocator_type)0x0;
  pdVar13[1] = 0.0;
  pdVar13[2] = 2.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = (double)&DAT_401c000000000000;
  pdVar13[5] = 0.0;
  pdVar13[6] = (double)&DAT_4008000000000000;
  pdVar13[7] = 0.0;
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x2) {
    local_170[0] = (allocator_type)0x0;
    if ((*pdVar13 ==
         *(double *)
          (local_140.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value) &&
       (!NAN(*pdVar13) &&
        !NAN(*(double *)
              (local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->_M_value))) {
      if ((pdVar13[1] ==
           *(double *)
            ((long)(local_140.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_value + 8)) &&
         (!NAN(pdVar13[1]) &&
          !NAN(*(double *)
                ((long)(local_140.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_value + 8)))) {
        lVar14 = 0;
        local_170[0] = (allocator_type)0x0;
        pcVar25 = local_140.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pdVar27 = pdVar13;
        do {
          lVar34 = 0x18;
          lVar35 = 0;
          while( true ) {
            if (lVar35 == 1) goto LAB_001ac6da;
            dVar5 = *(double *)((long)pdVar27 + lVar34 + -8);
            lVar35 = lVar35 + 1;
            pdVar3 = (double *)((long)pcVar25->_M_value + lVar34 + -8);
            if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
            pdVar3 = (double *)((long)pdVar27 + lVar34);
            pdVar1 = (double *)((long)pcVar25->_M_value + lVar34);
            lVar34 = lVar34 + 0x10;
            if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
          }
          if (lVar35 < 2) break;
LAB_001ac6da:
          lVar14 = lVar14 + 1;
          local_170[0] = (allocator_type)(1 < lVar14);
          if (lVar14 == 2) break;
          if ((pdVar13[lVar14 * 4] !=
               *(double *)
                local_140.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value) ||
             (NAN(pdVar13[lVar14 * 4]) ||
              NAN(*(double *)
                   local_140.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value))) break;
          pdVar27 = pdVar27 + 4;
          pcVar25 = pcVar25 + 2;
          if ((pdVar13[lVar14 * 4 + 1] !=
               *(double *)
                ((long)local_140.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value + 8)) ||
             (NAN(pdVar13[lVar14 * 4 + 1]) ||
              NAN(*(double *)
                   ((long)local_140.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[lVar14 * 2]._M_value + 8))))
          break;
        } while( true );
      }
    }
  }
  local_168._M_head_impl = (complex<double> *)0x0;
  if (!(bool)local_170[0]) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_170,(AssertionResult *)"mat1 == check1","false","true",
               (char *)pcVar25);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_168._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_168._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_170,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,(SquareMatrix<std::complex<double>_> *)local_1f8,&local_a8);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_170._1_7_,local_170[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar15) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)paVar15 < 1);
    if (0 < (long)paVar15) {
      local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)local_128._M_string_length ==
           (double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p) &&
         (!NAN(*(double *)local_128._M_string_length) &&
          !NAN((double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)(local_128._M_string_length + 8) ==
             *(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)(local_128._M_string_length + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)))) {
          pcVar24 = (char *)((long)paVar15 * 0x10);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          pdVar27 = (double *)local_128._M_string_length;
          _Var17._M_head_impl = local_168._M_head_impl;
          do {
            lVar14 = 0x18;
            pcVar18 = (char *)0x0;
            while( true ) {
              if (paVar15->_M_local_buf + -1 == pcVar18) goto LAB_001ac941;
              dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
              pcVar18 = pcVar18 + 1;
              pdVar3 = (double *)((long)_Var17._M_head_impl + lVar14 + -8);
              if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
              pdVar3 = (double *)((long)pdVar27 + lVar14);
              pdVar1 = (double *)
                       ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)_Var17._M_head_impl)->_M_dataplus)._M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
            }
            if ((long)pcVar18 < (long)paVar15) break;
LAB_001ac941:
            paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar28->_M_local_buf + 1);
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)paVar15 <= (long)paVar28);
            if (paVar28 == paVar15) break;
            if ((*(double *)
                  (local_128._M_string_length +
                  (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8) !=
                 *(double *)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8)) ||
                NAN(*(double *)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value)))
            break;
            pdVar27 = pdVar27 + (long)local_128._M_dataplus._M_p * 2;
            _Var17._M_head_impl =
                 (complex<double> *)
                 (pcVar24 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var17._M_head_impl)->_M_dataplus);
            if ((*(double *)
                  (local_128._M_string_length +
                  ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8) !=
                 *(double *)
                  ((long)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8)) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8)) ||
                NAN(*(double *)
                     ((long)local_168._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8))))
            break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  local_1b0._8_4_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_170,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  local_1f8 = (undefined1  [8])0x2;
  local_1f0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)(local_1f0._M_head_impl)->_M_value = 0;
  *(undefined8 *)((long)(local_1f0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_1f0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_1f0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_1f0._M_head_impl[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a8,(SquareMatrix<std::complex<double>_> *)local_1f8);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_170._1_7_,local_170[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar15) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)paVar15 < 1);
    if (0 < (long)paVar15) {
      local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)local_128._M_string_length == *(double *)local_168._M_head_impl) &&
         (!NAN(*(double *)local_128._M_string_length) && !NAN(*(double *)local_168._M_head_impl))) {
        if ((*(double *)(local_128._M_string_length + 8) ==
             *(double *)((long)local_168._M_head_impl + 8)) &&
           (!NAN(*(double *)(local_128._M_string_length + 8)) &&
            !NAN(*(double *)((long)local_168._M_head_impl + 8)))) {
          pcVar24 = (char *)((long)paVar15 * 0x10);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          pdVar27 = (double *)local_128._M_string_length;
          _Var17._M_head_impl = (complex<double> *)local_168;
          do {
            lVar14 = 0x18;
            pcVar18 = (char *)0x0;
            while( true ) {
              if (paVar15->_M_local_buf + -1 == pcVar18) goto LAB_001acbe2;
              dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
              pcVar18 = pcVar18 + 1;
              pdVar3 = (double *)
                       ((long)((_Alloc_hider *)(_Var17._M_head_impl)->_M_value + -1) + lVar14);
              if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
              pdVar3 = (double *)((long)pdVar27 + lVar14);
              pdVar1 = (double *)
                       ((long)&((_Alloc_hider *)(_Var17._M_head_impl)->_M_value)->_M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
            }
            if ((long)pcVar18 < (long)paVar15) break;
LAB_001acbe2:
            paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar28->_M_local_buf + 1);
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)paVar15 <= (long)paVar28);
            if (paVar28 == paVar15) break;
            pdVar3 = (double *)((long)local_168._M_head_impl + (long)paVar28 * (long)paVar15 * 0x10)
            ;
            if ((*(double *)
                  (local_128._M_string_length +
                  (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8) != *pdVar3) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8)) || NAN(*pdVar3)))
            break;
            pdVar27 = pdVar27 + (long)local_128._M_dataplus._M_p * 2;
            _Var17._M_head_impl = _Var17._M_head_impl + (long)paVar15;
            if ((*(double *)
                  (local_128._M_string_length +
                  ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8) !=
                 (double)((size_type *)((long)local_168._M_head_impl + 8))
                         [(long)paVar28 * (long)paVar15 * 2]) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     ((long)paVar28 * (long)local_128._M_dataplus._M_p * 2 + 1) * 8)) ||
                NAN((double)((size_type *)((long)local_168._M_head_impl + 8))
                            [(long)paVar28 * (long)paVar15 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c8[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1c8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_88);
  pcVar24 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)local_1b0,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x2;
  local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)operator_new__(0x40);
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0;
  *(undefined8 *)
   ((long)(local_188.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0;
  *(undefined8 *)
   ((long)(local_188.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1e0,(SquareMatrix<std::complex<double>_> *)&local_188,&local_a8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,&local_a8,(SquareMatrix<std::complex<double>_> *)local_1e0);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar15) {
    bVar36 = (long)paVar15 < 1;
    if (0 < (long)paVar15) {
      bVar36 = false;
      if ((*(double *)local_128._M_string_length ==
           (double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p) &&
         (!NAN(*(double *)local_128._M_string_length) &&
          !NAN((double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)(local_128._M_string_length + 8) ==
             *(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)(local_128._M_string_length + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)))) {
          pcVar24 = (char *)((long)paVar15 * 0x10);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          bVar36 = false;
          pdVar27 = (double *)local_128._M_string_length;
          _Var17._M_head_impl = local_1c0._M_head_impl;
          do {
            lVar14 = 0x18;
            pcVar18 = (char *)0x0;
            while( true ) {
              if (paVar15->_M_local_buf + -1 == pcVar18) goto LAB_001ace89;
              dVar5 = *(double *)((long)pdVar27 + lVar14 + -8);
              pcVar18 = pcVar18 + 1;
              pdVar3 = (double *)((long)_Var17._M_head_impl + lVar14 + -8);
              if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
              pdVar3 = (double *)((long)pdVar27 + lVar14);
              pdVar1 = (double *)
                       ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)_Var17._M_head_impl)->_M_dataplus)._M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
            }
            if ((long)pcVar18 < (long)paVar15) break;
LAB_001ace89:
            paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar28->_M_local_buf + 1);
            bVar36 = (long)paVar15 <= (long)paVar28;
            if (paVar28 == paVar15) break;
            if ((*(double *)
                  (local_128._M_string_length +
                  (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8) !=
                 *(double *)local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value) ||
               (NAN(*(double *)
                     (local_128._M_string_length +
                     (long)paVar28 * (long)local_128._M_dataplus._M_p * 2 * 8)) ||
                NAN(*(double *)local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value)))
            break;
            pdVar27 = pdVar27 + (long)local_128._M_dataplus._M_p * 2;
            _Var17._M_head_impl =
                 (complex<double> *)
                 (pcVar24 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var17._M_head_impl)->_M_dataplus);
            if ((((double *)(local_128._M_string_length + 8))
                 [(long)paVar28 * (long)local_128._M_dataplus._M_p * 2] !=
                 *(double *)(local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8)) ||
               (NAN(((double *)(local_128._M_string_length + 8))
                    [(long)paVar28 * (long)local_128._M_dataplus._M_p * 2]) ||
                NAN(*(double *)(local_1c0._M_head_impl[(long)paVar28 * (long)paVar15]._M_value + 8))
               )) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((double *)local_128._M_string_length != (double *)0x0) {
    operator_delete__((void *)local_128._M_string_length);
  }
  local_128._M_string_length = 0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1d8._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1d8._M_head_impl);
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete__(local_188.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_1f8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if (local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  if (local_168._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_168._M_head_impl);
  }
  operator_delete__(pdVar13);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_128._M_string_length = local_128._M_string_length & 0xffffff0000000000;
  local_128.field_2._M_allocated_capacity = 0;
  local_128.field_2._8_8_ = 0x3ff0000000000000;
  local_128._M_dataplus._M_p = (pointer)&PTR_nbQubits_00521598;
  local_1b0._0_8_ = (pointer)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_bff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&local_140,(SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_170,&local_a8);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  pcVar25 = (pointer)CONCAT71(local_170._1_7_,local_170[0]);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == pcVar25) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)pcVar25 < 1);
    if (0 < (long)pcVar25) {
      vVar21 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)
            local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish ==
           (double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p) &&
         (local_1c8[0] = vVar21,
         !NAN(*(double *)
               local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
         !NAN((double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)
              ((long)local_140.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) ==
             *(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)
                  ((long)local_140.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)))) {
          pcVar24 = (char *)((long)pcVar25 * 0x10);
          pcVar29 = (pointer)0x0;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          _Var17._M_head_impl = local_168._M_head_impl;
          _Var33._M_head_impl =
               local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          do {
            lVar14 = 0x18;
            lVar34 = 0;
            while( true ) {
              if ((long)pcVar25[-1]._M_value + 0xf == lVar34) goto LAB_001ad1c4;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14 + -8);
              lVar34 = lVar34 + 1;
              pdVar13 = (double *)((long)_Var17._M_head_impl + lVar14 + -8);
              if ((dVar5 != *pdVar13) || (NAN(dVar5) || NAN(*pdVar13))) break;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14);
              pdVar13 = (double *)
                        ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_Var17._M_head_impl)->_M_dataplus)._M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar13) || (NAN(dVar5) || NAN(*pdVar13))) break;
            }
            if (lVar34 < (long)pcVar25) break;
LAB_001ad1c4:
            pcVar29 = (pointer)((long)pcVar29->_M_value + 1);
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)pcVar25 <= (long)pcVar29);
            if (pcVar29 == pcVar25) break;
            dVar5 = *(double *)
                     ((pointer)
                     ((long)local_140.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                     (long)pcVar29 *
                     (long)local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start * 0x10))->_M_value;
            if ((dVar5 != *(double *)local_168._M_head_impl[(long)pcVar29 * (long)pcVar25]._M_value)
               || (NAN(dVar5) ||
                   NAN(*(double *)local_168._M_head_impl[(long)pcVar29 * (long)pcVar25]._M_value)))
            break;
            _Var33._M_head_impl =
                 _Var33._M_head_impl +
                 (long)local_140.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            _Var17._M_head_impl =
                 (complex<double> *)
                 (pcVar24 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var17._M_head_impl)->_M_dataplus);
            if ((((double *)
                 ((long)local_140.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 8))
                 [(long)pcVar29 *
                  (long)local_140.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start * 2] !=
                 *(double *)
                  ((long)local_168._M_head_impl[(long)pcVar29 * (long)pcVar25]._M_value + 8)) ||
               (NAN(((double *)
                    ((long)local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8))
                    [(long)pcVar29 *
                     (long)local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start * 2]) ||
                NAN(*(double *)
                     ((long)local_168._M_head_impl[(long)pcVar29 * (long)pcVar25]._M_value + 8))))
            break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if (!(bool)local_1c8[0]) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == Ytrans","false"
               ,"true",pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  local_1b0._0_8_ = (AssertHelperData *)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(double *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0.0;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0.0;
  *(double *)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = 0.0;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0.0;
  *(double *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0.0;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0.0;
  *(double *)((pointer)local_1b0._8_8_)->_M_value = 0.0;
  *(double *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0.0;
  *(double *)((pointer)local_1b0._8_8_)->_M_value = 2.0;
  *(double *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0.0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = &DAT_4014000000000000;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0.0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_4008000000000000;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0.0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = &DAT_401c000000000000;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0.0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_170,
             (SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  _Var17._M_head_impl = (complex<double> *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  pdVar13 = (double *)operator_new__(0x40);
  *pdVar13 = 0.0;
  pdVar13[1] = 0.0;
  pdVar13[2] = 0.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 0.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  *pdVar13 = -3.0;
  local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  pdVar13[1] = 0.0;
  pdVar13[2] = -7.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 2.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = (double)&DAT_4014000000000000;
  pdVar13[7] = 0.0;
  if (CONCAT71(local_170._1_7_,local_170[0]) == 2) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    if ((*pdVar13 == *(double *)local_168._M_head_impl) &&
       (!NAN(*pdVar13) && !NAN(*(double *)local_168._M_head_impl))) {
      if ((pdVar13[1] == *(double *)((long)local_168._M_head_impl + 8)) &&
         (!NAN(pdVar13[1]) && !NAN(*(double *)((long)local_168._M_head_impl + 8)))) {
        lVar14 = 0;
        local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
        _Var17._M_head_impl = (complex<double> *)local_168;
        pdVar27 = pdVar13;
        do {
          lVar34 = 0x18;
          lVar35 = 0;
          while( true ) {
            if (lVar35 == 1) goto LAB_001ad497;
            dVar5 = *(double *)((long)pdVar27 + lVar34 + -8);
            lVar35 = lVar35 + 1;
            pdVar3 = (double *)
                     ((long)((_Alloc_hider *)(_Var17._M_head_impl)->_M_value + -1) + lVar34);
            if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
            pdVar3 = (double *)((long)pdVar27 + lVar34);
            pdVar1 = (double *)
                     ((long)&((_Alloc_hider *)(_Var17._M_head_impl)->_M_value)->_M_p + lVar34);
            lVar34 = lVar34 + 0x10;
            if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
          }
          if (lVar35 < 2) break;
LAB_001ad497:
          lVar14 = lVar14 + 1;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                         (1 < lVar14);
          if (lVar14 == 2) break;
          pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_168._M_head_impl + lVar14 * 0x20);
          if ((pdVar13[lVar14 * 4] != (double)(pbVar2->_M_dataplus)._M_p) ||
             (NAN(pdVar13[lVar14 * 4]) || NAN((double)(pbVar2->_M_dataplus)._M_p))) break;
          pdVar27 = pdVar27 + 4;
          _Var17._M_head_impl = _Var17._M_head_impl + 2;
          if ((pdVar13[lVar14 * 4 + 1] !=
               (double)((size_type *)((long)local_168._M_head_impl + 8))[lVar14 * 4]) ||
             (NAN(pdVar13[lVar14 * 4 + 1]) ||
              NAN((double)((size_type *)((long)local_168._M_head_impl + 8))[lVar14 * 4]))) break;
        } while( true );
      }
    }
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if (!(bool)local_1c8[0]) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == check1","false"
               ,"true",(char *)_Var17._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a8);
  pAVar31 = (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((AssertHelperData *)local_1b0._0_8_ == pAVar31) {
    bVar36 = (long)pAVar31 < 1;
    if (0 < (long)pAVar31) {
      bVar36 = false;
      if ((*(double *)local_1b0._8_8_ ==
           (double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p) &&
         (!NAN(*(double *)local_1b0._8_8_) &&
          !NAN((double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)(local_1b0._8_8_ + 8) ==
             *(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)(local_1b0._8_8_ + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)))) {
          pcVar24 = (char *)((long)pAVar31 * 0x10);
          pAVar30 = (AssertHelperData *)0x0;
          bVar36 = false;
          _Var17._M_head_impl = (complex<double> *)local_1b0._8_8_;
          _Var33._M_head_impl = local_1c0._M_head_impl;
          do {
            lVar14 = 0x18;
            puVar32 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)((long)&pAVar31[-1].message.field_2 + 0xf) == puVar32)
              goto LAB_001ad696;
              dVar5 = *(double *)((long)(_Var17._M_head_impl)->_M_value + lVar14 + -8);
              puVar32 = puVar32 + 1;
              pdVar27 = (double *)((long)_Var33._M_head_impl + lVar14 + -8);
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
              dVar5 = *(double *)((long)(_Var17._M_head_impl)->_M_value + lVar14);
              pdVar27 = (double *)
                        ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_Var33._M_head_impl)->_M_dataplus)._M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            }
            if ((long)puVar32 < (long)pAVar31) break;
LAB_001ad696:
            pAVar30 = (AssertHelperData *)((long)&pAVar30->type + 1);
            bVar36 = (long)pAVar31 <= (long)pAVar30;
            if (pAVar30 == pAVar31) break;
            dVar5 = *(double *)
                     ((pointer)(local_1b0._8_8_ + (long)pAVar30 * local_1b0._0_8_ * 0x10))->_M_value
            ;
            if ((dVar5 != *(double *)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value)
               || (NAN(dVar5) ||
                   NAN(*(double *)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value)))
            break;
            _Var17._M_head_impl = _Var17._M_head_impl + local_1b0._0_8_;
            _Var33._M_head_impl =
                 (complex<double> *)
                 (pcVar24 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var33._M_head_impl)->_M_dataplus);
            if ((((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2] !=
                 *(double *)
                  ((long)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value + 8)) ||
               (NAN(((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2]) ||
                NAN(*(double *)
                     ((long)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value + 8))))
            break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar24
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  local_128._M_string_length = CONCAT44(local_128._M_string_length._4_4_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a8,(SquareMatrix<std::complex<double>_> *)&local_140);
  pAVar31 = (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((AssertHelperData *)local_1b0._0_8_ == pAVar31) {
    bVar36 = (long)pAVar31 < 1;
    if (0 < (long)pAVar31) {
      bVar36 = false;
      if ((*(double *)local_1b0._8_8_ == *(double *)local_1c0._M_head_impl) &&
         (!NAN(*(double *)local_1b0._8_8_) && !NAN(*(double *)local_1c0._M_head_impl))) {
        if ((*(double *)(local_1b0._8_8_ + 8) == *(double *)((long)local_1c0._M_head_impl + 8)) &&
           (!NAN(*(double *)(local_1b0._8_8_ + 8)) &&
            !NAN(*(double *)((long)local_1c0._M_head_impl + 8)))) {
          pcVar24 = (char *)((long)pAVar31 * 0x10);
          pAVar30 = (AssertHelperData *)0x0;
          bVar36 = false;
          _Var17._M_head_impl = (complex<double> *)local_1b0._8_8_;
          _Var33._M_head_impl = (complex<double> *)local_1c0;
          do {
            lVar14 = 0x18;
            puVar32 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)((long)&pAVar31[-1].message.field_2 + 0xf) == puVar32)
              goto LAB_001ad8c1;
              dVar5 = *(double *)((long)(_Var17._M_head_impl)->_M_value + lVar14 + -8);
              puVar32 = puVar32 + 1;
              pdVar27 = (double *)
                        ((long)((_Alloc_hider *)(_Var33._M_head_impl)->_M_value + -1) + lVar14);
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
              dVar5 = *(double *)((long)(_Var17._M_head_impl)->_M_value + lVar14);
              pdVar27 = (double *)
                        ((long)&((_Alloc_hider *)(_Var33._M_head_impl)->_M_value)->_M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            }
            if ((long)puVar32 < (long)pAVar31) break;
LAB_001ad8c1:
            pAVar30 = (AssertHelperData *)((long)&pAVar30->type + 1);
            bVar36 = (long)pAVar31 <= (long)pAVar30;
            if (pAVar30 == pAVar31) break;
            dVar5 = *(double *)
                     ((pointer)(local_1b0._8_8_ + (long)pAVar30 * local_1b0._0_8_ * 0x10))->_M_value
            ;
            pdVar27 = (double *)
                      ((long)local_1c0._M_head_impl + (long)pAVar30 * (long)pAVar31 * 0x10);
            if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            _Var17._M_head_impl = _Var17._M_head_impl + local_1b0._0_8_;
            _Var33._M_head_impl = _Var33._M_head_impl + (long)pAVar31;
            if ((((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2] !=
                 (double)((size_type *)((long)local_1c0._M_head_impl + 8))
                         [(long)pAVar30 * (long)pAVar31 * 2]) ||
               (NAN(((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2]) ||
                NAN((double)((size_type *)((long)local_1c0._M_head_impl + 8))
                            [(long)pAVar30 * (long)pAVar31 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar24
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1f8,&local_88);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Left,Trans,3,
             (SquareMatrix<std::complex<double>_> *)local_1f8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_188,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a8,(SquareMatrix<std::complex<double>_> *)&local_188);
  if ((undefined1  [8])local_1b0._0_8_ == local_1f8) {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)local_1f8 < 1);
    if (0 < (long)local_1f8) {
      local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)local_1b0._8_8_ == *(double *)local_1f0._M_head_impl) &&
         (!NAN(*(double *)local_1b0._8_8_) && !NAN(*(double *)local_1f0._M_head_impl))) {
        if ((((double *)local_1b0._8_8_)[1] == *(double *)((long)local_1f0._M_head_impl + 8)) &&
           (!NAN(((double *)local_1b0._8_8_)[1]) &&
            !NAN(*(double *)((long)local_1f0._M_head_impl + 8)))) {
          pcVar24 = (char *)((long)local_1f8 * 0x10);
          pAVar31 = (AssertHelperData *)0x0;
          local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          pcVar25 = (pointer)local_1b0._8_8_;
          _Var17._M_head_impl = (complex<double> *)local_1f0;
          do {
            lVar14 = 0x18;
            puVar32 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)
                  ((long)&(((AssertHelperData *)((long)local_1f8 + -0x38))->message).field_2 + 0xf)
                  == puVar32) goto LAB_001adaf0;
              dVar5 = *(double *)((long)pcVar25->_M_value + lVar14 + -8);
              puVar32 = puVar32 + 1;
              pdVar27 = (double *)
                        ((long)((_Alloc_hider *)(_Var17._M_head_impl)->_M_value + -1) + lVar14);
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
              dVar5 = *(double *)((long)pcVar25->_M_value + lVar14);
              pdVar27 = (double *)
                        ((long)&((_Alloc_hider *)(_Var17._M_head_impl)->_M_value)->_M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            }
            if ((long)puVar32 < (long)local_1f8) break;
LAB_001adaf0:
            pAVar31 = (AssertHelperData *)((long)&pAVar31->type + 1);
            local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)local_1f8 <= (long)pAVar31);
            if ((undefined1  [8])pAVar31 == local_1f8) break;
            pdVar27 = (double *)
                      ((long)local_1f0._M_head_impl + (long)pAVar31 * (long)local_1f8 * 0x10);
            if ((*(double *)
                  ((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->_M_value !=
                 *pdVar27) ||
               (NAN(*(double *)
                     ((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->_M_value
                   ) || NAN(*pdVar27))) break;
            pcVar25 = pcVar25 + local_1b0._0_8_;
            _Var17._M_head_impl = _Var17._M_head_impl + (long)local_1f8;
            if ((*(double *)
                  ((long)((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->
                         _M_value + 8) !=
                 (double)((size_type *)((long)local_1f0._M_head_impl + 8))
                         [(long)pAVar31 * (long)local_1f8 * 2]) ||
               (NAN(*(double *)
                     ((long)((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->
                            _M_value + 8)) ||
                NAN((double)((size_type *)((long)local_1f0._M_head_impl + 8))
                            [(long)pAVar31 * (long)local_1f8 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  local_1b0._8_8_ =
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_188.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1e0[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1e0,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar24);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_188.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  operator_delete__(pdVar13);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_168._M_head_impl);
  }
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_128._M_string_length = local_128._M_string_length & 0xffffff0000000000;
  local_128.field_2._M_allocated_capacity = 0;
  local_128.field_2._8_8_ = 0x3ff0000000000000;
  local_128._M_dataplus._M_p = (pointer)&PTR_nbQubits_00521598;
  local_1b0._0_8_ = (pointer)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined8 *)((pointer)local_1b0._8_8_)->_M_value = 0;
  *(undefined8 *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_bff0000000000000;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0;
  *(undefined8 *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0;
  *(undefined8 *)(((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0;
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&local_140,(SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_170,&local_a8);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  pcVar25 = (pointer)CONCAT71(local_170._1_7_,local_170[0]);
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start == pcVar25) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)pcVar25 < 1);
    if (0 < (long)pcVar25) {
      vVar21 = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)
            local_140.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish == *(double *)local_168._M_head_impl) &&
         (local_1c8[0] = vVar21,
         !NAN(*(double *)
               local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish) && !NAN(*(double *)local_168._M_head_impl)
         )) {
        if ((*(double *)
              ((long)local_140.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) ==
             *(double *)((long)local_168._M_head_impl + 8)) &&
           (!NAN(*(double *)
                  ((long)local_140.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 8)) &&
            !NAN(*(double *)((long)local_168._M_head_impl + 8)))) {
          pcVar24 = (char *)((long)pcVar25 * 0x10);
          pcVar29 = (pointer)0x0;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          _Var17._M_head_impl = (complex<double> *)local_168;
          _Var33._M_head_impl =
               local_140.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          do {
            lVar14 = 0x18;
            lVar34 = 0;
            while( true ) {
              if ((long)pcVar25[-1]._M_value + 0xf == lVar34) goto LAB_001ade1d;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14 + -8);
              lVar34 = lVar34 + 1;
              pdVar13 = (double *)
                        ((long)((_Alloc_hider *)(_Var17._M_head_impl)->_M_value + -1) + lVar14);
              if ((dVar5 != *pdVar13) || (NAN(dVar5) || NAN(*pdVar13))) break;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14);
              pdVar13 = (double *)
                        ((long)&((_Alloc_hider *)(_Var17._M_head_impl)->_M_value)->_M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar13) || (NAN(dVar5) || NAN(*pdVar13))) break;
            }
            if (lVar34 < (long)pcVar25) break;
LAB_001ade1d:
            pcVar29 = (pointer)((long)pcVar29->_M_value + 1);
            local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)pcVar25 <= (long)pcVar29);
            if (pcVar29 == pcVar25) break;
            dVar5 = *(double *)
                     ((pointer)
                     ((long)local_140.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                     (long)pcVar29 *
                     (long)local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start * 0x10))->_M_value;
            pdVar13 = (double *)
                      ((long)local_168._M_head_impl + (long)pcVar29 * (long)pcVar25 * 0x10);
            if ((dVar5 != *pdVar13) || (NAN(dVar5) || NAN(*pdVar13))) break;
            _Var33._M_head_impl =
                 _Var33._M_head_impl +
                 (long)local_140.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            _Var17._M_head_impl = _Var17._M_head_impl + (long)pcVar25;
            if ((((double *)
                 ((long)local_140.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 8))
                 [(long)pcVar29 *
                  (long)local_140.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start * 2] !=
                 (double)((size_type *)((long)local_168._M_head_impl + 8))
                         [(long)pcVar29 * (long)pcVar25 * 2]) ||
               (NAN(((double *)
                    ((long)local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8))
                    [(long)pcVar29 *
                     (long)local_140.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start * 2]) ||
                NAN((double)((size_type *)((long)local_168._M_head_impl + 8))
                            [(long)pcVar29 * (long)pcVar25 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if (!(bool)local_1c8[0]) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == Ytrans","false"
               ,"true",pcVar24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  local_1b0._0_8_ = (AssertHelperData *)0x2;
  local_1b0._8_8_ = operator_new__(0x40);
  *(double *)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = 0.0;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0.0;
  *(double *)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = 0.0;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0.0;
  *(double *)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = 0.0;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0.0;
  *(double *)((pointer)local_1b0._8_8_)->_M_value = 0.0;
  *(double *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0.0;
  *(double *)((pointer)local_1b0._8_8_)->_M_value = 2.0;
  *(double *)((long)((pointer)local_1b0._8_8_)->_M_value + 8) = 0.0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x10))->_M_value = &DAT_4014000000000000;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x10))->_M_value + 8) = 0.0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x20))->_M_value = &DAT_4008000000000000;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x20))->_M_value + 8) = 0.0;
  *(undefined1 **)((pointer)(local_1b0._8_8_ + 0x30))->_M_value = &DAT_401c000000000000;
  *(double *)((long)((pointer)(local_1b0._8_8_ + 0x30))->_M_value + 8) = 0.0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_170,
             (SquareMatrix<std::complex<double>_> *)local_1b0);
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  _Var17._M_head_impl = (complex<double> *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,1,
             (SquareMatrix<std::complex<double>_> *)local_170,0);
  pdVar13 = (double *)operator_new__(0x40);
  *pdVar13 = 0.0;
  pdVar13[1] = 0.0;
  pdVar13[2] = 0.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = 0.0;
  pdVar13[5] = 0.0;
  pdVar13[6] = 0.0;
  pdVar13[7] = 0.0;
  *pdVar13 = (double)&DAT_4014000000000000;
  local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  pdVar13[1] = 0.0;
  pdVar13[2] = -2.0;
  pdVar13[3] = 0.0;
  pdVar13[4] = (double)&DAT_401c000000000000;
  pdVar13[5] = 0.0;
  pdVar13[6] = -3.0;
  pdVar13[7] = 0.0;
  if (CONCAT71(local_170._1_7_,local_170[0]) == 2) {
    local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
    if ((*pdVar13 == (double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p) &&
       (!NAN(*pdVar13) && !NAN((double)((_Alloc_hider *)(local_168._M_head_impl)->_M_value)->_M_p)))
    {
      if ((pdVar13[1] == *(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)) &&
         (!NAN(pdVar13[1]) &&
          !NAN(*(double *)((_Alloc_hider *)(local_168._M_head_impl)->_M_value + 1)))) {
        lVar14 = 0;
        local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
        _Var17._M_head_impl = local_168._M_head_impl;
        pdVar27 = pdVar13;
        do {
          lVar34 = 0x18;
          lVar35 = 0;
          while( true ) {
            if (lVar35 == 1) goto LAB_001ae0ef;
            dVar5 = *(double *)((long)pdVar27 + lVar34 + -8);
            lVar35 = lVar35 + 1;
            pdVar3 = (double *)((long)_Var17._M_head_impl + lVar34 + -8);
            if ((dVar5 != *pdVar3) || (NAN(dVar5) || NAN(*pdVar3))) break;
            pdVar3 = (double *)((long)pdVar27 + lVar34);
            pdVar1 = (double *)
                     ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _Var17._M_head_impl)->_M_dataplus)._M_p + lVar34);
            lVar34 = lVar34 + 0x10;
            if ((*pdVar3 != *pdVar1) || (NAN(*pdVar3) || NAN(*pdVar1))) break;
          }
          if (lVar35 < 2) break;
LAB_001ae0ef:
          lVar14 = lVar14 + 1;
          local_1c8[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                         (1 < lVar14);
          if (lVar14 == 2) break;
          if ((pdVar13[lVar14 * 4] != *(double *)local_168._M_head_impl[lVar14 * 2]._M_value) ||
             (NAN(pdVar13[lVar14 * 4]) ||
              NAN(*(double *)local_168._M_head_impl[lVar14 * 2]._M_value))) break;
          pdVar27 = pdVar27 + 4;
          _Var17._M_head_impl = (complex<double> *)((long)_Var17._M_head_impl + 0x20);
          if ((pdVar13[lVar14 * 4 + 1] !=
               *(double *)((long)local_168._M_head_impl[lVar14 * 2]._M_value + 8)) ||
             (NAN(pdVar13[lVar14 * 4 + 1]) ||
              NAN(*(double *)((long)local_168._M_head_impl[lVar14 * 2]._M_value + 8)))) break;
        } while( true );
      }
    }
  }
  local_1c0._M_head_impl = (complex<double> *)0x0;
  if (!(bool)local_1c8[0]) {
    testing::Message::Message((Message *)local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1c8,(AssertionResult *)"mat1 == check1","false"
               ,"true",(char *)_Var17._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a8);
  pAVar31 = (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((AssertHelperData *)local_1b0._0_8_ == pAVar31) {
    bVar36 = (long)pAVar31 < 1;
    if (0 < (long)pAVar31) {
      bVar36 = false;
      if ((*(double *)local_1b0._8_8_ ==
           (double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p) &&
         (!NAN(*(double *)local_1b0._8_8_) &&
          !NAN((double)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)(local_1b0._8_8_ + 8) ==
             *(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)(local_1b0._8_8_ + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_1c0._M_head_impl)->_M_value + 1)))) {
          pcVar24 = (char *)((long)pAVar31 * 0x10);
          pAVar30 = (AssertHelperData *)0x0;
          bVar36 = false;
          _Var17._M_head_impl = local_1c0._M_head_impl;
          _Var33._M_head_impl = (complex<double> *)local_1b0._8_8_;
          do {
            lVar14 = 0x18;
            puVar32 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)((long)&pAVar31[-1].message.field_2 + 0xf) == puVar32)
              goto LAB_001ae2ef;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14 + -8);
              puVar32 = puVar32 + 1;
              pdVar27 = (double *)((long)_Var17._M_head_impl + lVar14 + -8);
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14);
              pdVar27 = (double *)
                        ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_Var17._M_head_impl)->_M_dataplus)._M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            }
            if ((long)puVar32 < (long)pAVar31) break;
LAB_001ae2ef:
            pAVar30 = (AssertHelperData *)((long)&pAVar30->type + 1);
            bVar36 = (long)pAVar31 <= (long)pAVar30;
            if (pAVar30 == pAVar31) break;
            dVar5 = *(double *)
                     ((pointer)(local_1b0._8_8_ + (long)pAVar30 * local_1b0._0_8_ * 0x10))->_M_value
            ;
            if ((dVar5 != *(double *)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value)
               || (NAN(dVar5) ||
                   NAN(*(double *)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value)))
            break;
            _Var33._M_head_impl = _Var33._M_head_impl + local_1b0._0_8_;
            _Var17._M_head_impl =
                 (complex<double> *)
                 (pcVar24 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var17._M_head_impl)->_M_dataplus);
            if ((((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2] !=
                 *(double *)
                  ((long)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value + 8)) ||
               (NAN(((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2]) ||
                NAN(*(double *)
                     ((long)local_1c0._M_head_impl[(long)pAVar30 * (long)pAVar31]._M_value + 8))))
            break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar24
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  local_128._M_string_length = CONCAT44(local_128._M_string_length._4_4_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_1c8,&local_98);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,2,
             (SquareMatrix<std::complex<double>_> *)local_1c8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a8,(SquareMatrix<std::complex<double>_> *)&local_140);
  pAVar31 = (AssertHelperData *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if ((AssertHelperData *)local_1b0._0_8_ == pAVar31) {
    bVar36 = (long)pAVar31 < 1;
    if (0 < (long)pAVar31) {
      bVar36 = false;
      if ((*(double *)local_1b0._8_8_ == *(double *)local_1c0._M_head_impl) &&
         (!NAN(*(double *)local_1b0._8_8_) && !NAN(*(double *)local_1c0._M_head_impl))) {
        if ((*(double *)(local_1b0._8_8_ + 8) == *(double *)((long)local_1c0._M_head_impl + 8)) &&
           (!NAN(*(double *)(local_1b0._8_8_ + 8)) &&
            !NAN(*(double *)((long)local_1c0._M_head_impl + 8)))) {
          pcVar24 = (char *)((long)pAVar31 * 0x10);
          pAVar30 = (AssertHelperData *)0x0;
          bVar36 = false;
          _Var17._M_head_impl = (complex<double> *)local_1c0;
          _Var33._M_head_impl = (complex<double> *)local_1b0._8_8_;
          do {
            lVar14 = 0x18;
            puVar32 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)((long)&pAVar31[-1].message.field_2 + 0xf) == puVar32)
              goto LAB_001ae51a;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14 + -8);
              puVar32 = puVar32 + 1;
              pdVar27 = (double *)
                        ((long)((_Alloc_hider *)(_Var17._M_head_impl)->_M_value + -1) + lVar14);
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
              dVar5 = *(double *)((long)(_Var33._M_head_impl)->_M_value + lVar14);
              pdVar27 = (double *)
                        ((long)&((_Alloc_hider *)(_Var17._M_head_impl)->_M_value)->_M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            }
            if ((long)puVar32 < (long)pAVar31) break;
LAB_001ae51a:
            pAVar30 = (AssertHelperData *)((long)&pAVar30->type + 1);
            bVar36 = (long)pAVar31 <= (long)pAVar30;
            if (pAVar30 == pAVar31) break;
            dVar5 = *(double *)
                     ((pointer)(local_1b0._8_8_ + (long)pAVar30 * local_1b0._0_8_ * 0x10))->_M_value
            ;
            pdVar27 = (double *)
                      ((long)local_1c0._M_head_impl + (long)pAVar30 * (long)pAVar31 * 0x10);
            if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            _Var33._M_head_impl = _Var33._M_head_impl + local_1b0._0_8_;
            _Var17._M_head_impl = _Var17._M_head_impl + (long)pAVar31;
            if ((((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2] !=
                 (double)((size_type *)((long)local_1c0._M_head_impl + 8))
                         [(long)pAVar30 * (long)pAVar31 * 2]) ||
               (NAN(((double *)(local_1b0._8_8_ + 8))[(long)pAVar30 * local_1b0._0_8_ * 2]) ||
                NAN((double)((size_type *)((long)local_1c0._M_head_impl + 8))
                            [(long)pAVar30 * (long)pAVar31 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_1f8[0] = (allocator_type)bVar36;
  local_1f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1b0._8_8_ != (complex<double> *)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  if (local_1f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1f8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar24
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1e0._1_7_,local_1e0[0]) + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1f8,&local_88);
  pcVar24 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&local_128,Right,Trans,3,
             (SquareMatrix<std::complex<double>_> *)local_1f8,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_188,(SquareMatrix<std::complex<double>_> *)&local_140,&local_a8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_1b0,&local_a8,(SquareMatrix<std::complex<double>_> *)&local_188);
  if ((undefined1  [8])local_1b0._0_8_ == local_1f8) {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                   ((long)local_1f8 < 1);
    if (0 < (long)local_1f8) {
      local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
      if ((*(double *)local_1b0._8_8_ == *(double *)local_1f0._M_head_impl) &&
         (!NAN(*(double *)local_1b0._8_8_) && !NAN(*(double *)local_1f0._M_head_impl))) {
        if ((((double *)local_1b0._8_8_)[1] == *(double *)((long)local_1f0._M_head_impl + 8)) &&
           (!NAN(((double *)local_1b0._8_8_)[1]) &&
            !NAN(*(double *)((long)local_1f0._M_head_impl + 8)))) {
          pcVar24 = (char *)((long)local_1f8 * 0x10);
          pAVar31 = (AssertHelperData *)0x0;
          local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
          _Var17._M_head_impl = (complex<double> *)local_1f0;
          pcVar25 = (pointer)local_1b0._8_8_;
          do {
            lVar14 = 0x18;
            puVar32 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)
                  ((long)&(((AssertHelperData *)((long)local_1f8 + -0x38))->message).field_2 + 0xf)
                  == puVar32) goto LAB_001ae74c;
              dVar5 = *(double *)((long)pcVar25->_M_value + lVar14 + -8);
              puVar32 = puVar32 + 1;
              pdVar27 = (double *)
                        ((long)((_Alloc_hider *)(_Var17._M_head_impl)->_M_value + -1) + lVar14);
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
              dVar5 = *(double *)((long)pcVar25->_M_value + lVar14);
              pdVar27 = (double *)
                        ((long)&((_Alloc_hider *)(_Var17._M_head_impl)->_M_value)->_M_p + lVar14);
              lVar14 = lVar14 + 0x10;
              if ((dVar5 != *pdVar27) || (NAN(dVar5) || NAN(*pdVar27))) break;
            }
            if ((long)puVar32 < (long)local_1f8) break;
LAB_001ae74c:
            pAVar31 = (AssertHelperData *)((long)&pAVar31->type + 1);
            local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)
                           ((long)local_1f8 <= (long)pAVar31);
            if ((undefined1  [8])pAVar31 == local_1f8) break;
            pdVar27 = (double *)
                      ((long)local_1f0._M_head_impl + (long)pAVar31 * (long)local_1f8 * 0x10);
            if ((*(double *)
                  ((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->_M_value !=
                 *pdVar27) ||
               (NAN(*(double *)
                     ((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->_M_value
                   ) || NAN(*pdVar27))) break;
            pcVar25 = pcVar25 + local_1b0._0_8_;
            _Var17._M_head_impl = _Var17._M_head_impl + (long)local_1f8;
            if ((*(double *)
                  ((long)((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->
                         _M_value + 8) !=
                 (double)((size_type *)((long)local_1f0._M_head_impl + 8))
                         [(long)pAVar31 * (long)local_1f8 * 2]) ||
               (NAN(*(double *)
                     ((long)((pointer)(local_1b0._8_8_ + (long)pAVar31 * local_1b0._0_8_ * 0x10))->
                            _M_value + 8)) ||
                NAN((double)((size_type *)((long)local_1f0._M_head_impl + 8))
                            [(long)pAVar31 * (long)local_1f8 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    local_1e0[0] = (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0;
  }
  local_1d8._M_head_impl = (complex<double> *)0x0;
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_1b0._8_8_);
  }
  local_1b0._8_8_ =
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_188.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1e0[0] == (vector<std::complex<double>,std::allocator<std::complex<double>>>)0x0) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b0,(internal *)local_1e0,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar24);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,(char *)local_1b0._0_8_);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((AssertHelperData *)local_1b0._0_8_ != (AssertHelperData *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if (local_188.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_188.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1f0._M_head_impl);
  }
  if (local_1c0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_1c0._M_head_impl);
  }
  operator_delete__(pdVar13);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_168._M_head_impl);
  }
  if (local_140.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_140.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_78.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)
      local_88.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_88.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if (local_98.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_98.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if (local_a8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_a8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}